

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midiclock.cpp
# Opt level: O2

int clock_in(void)

{
  bool bVar1;
  RtMidiIn *rtmidi;
  allocator<char> local_45;
  uint clock_count;
  char input;
  
  clock_count = 0;
  rtmidi = (RtMidiIn *)operator_new(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input,"RtMidi Input Client",&local_45);
  RtMidiIn::RtMidiIn(rtmidi,0,&input,100);
  std::__cxx11::string::~string((string *)&input);
  bVar1 = chooseInputPort(rtmidi);
  if (bVar1) {
    RtMidiIn::setCallback(rtmidi,mycallback,&clock_count);
    (**(code **)(**(long **)(rtmidi + 8) + 0x58))(*(long **)(rtmidi + 8),0,0,0);
    std::operator<<((ostream *)&std::cout,"\nReading MIDI input ... press <enter> to quit.\n");
    std::istream::get((char *)&std::cin);
  }
  (**(code **)(*(long *)rtmidi + 0x40))(rtmidi);
  return 0;
}

Assistant:

int clock_in()
{
  RtMidiIn *midiin = 0;
  unsigned int clock_count = 0;

  try {

    // RtMidiIn constructor
    midiin = new RtMidiIn();

    // Call function to select port.
    if ( chooseInputPort( midiin ) == false ) goto cleanup;

    // Set our callback function.  This should be done immediately after
    // opening the port to avoid having incoming messages written to the
    // queue instead of sent to the callback function.
    midiin->setCallback( &mycallback, &clock_count );

    // Don't ignore sysex, timing, or active sensing messages.
    midiin->ignoreTypes( false, false, false );

    std::cout << "\nReading MIDI input ... press <enter> to quit.\n";
    char input;
    std::cin.get(input);

  } catch ( RtMidiError &error ) {
    error.printMessage();
  }

 cleanup:

  delete midiin;

  return 0;
}